

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

bool CheckEthernetV2(AmpIO *Board)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint8_t HashReg;
  uint16_t HashValue;
  uchar MulticastMAC [6];
  uint8_t local_39;
  uint16_t local_38;
  uchar local_36 [6];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Checking --- start ---",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  bVar1 = CheckRegister(Board,'\x10',0xfff0,0x9400);
  bVar2 = CheckRegister(Board,'\x12',0xffff,0xe13);
  bVar3 = CheckRegister(Board,'\x14',0xffff,0xfa61);
  bVar4 = CheckRegister(Board,0x84,0x4000,0x4000);
  bVar5 = CheckRegister(Board,'p',0x1ff,0x1ef);
  bVar6 = CheckRegister(Board,0x86,0x4000,0x4000);
  bVar7 = CheckRegister(Board,0x9c,0xff,1);
  bVar8 = CheckRegister(Board,'t',0xffff,0x7ce1);
  EthBasePort::GetDestMulticastMacAddr(local_36);
  ComputeMulticastHash(local_36,&local_39,&local_38);
  bVar9 = CheckRegister(Board,local_39,0xffff,local_38);
  bVar10 = CheckRegister(Board,0x82,0x3f7,0x20);
  bVar11 = CheckRegister(Board,0x90,0xffff,0xa000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Checking ---- end ----",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return (bVar11 && bVar10) &&
         (bVar9 && (bVar8 && ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)))
                   ));
}

Assistant:

bool CheckEthernetV2(AmpIO &Board)
{
    std::cout << "Checking --- start ---" << "\n";
    bool ret = true;
    ret &= CheckRegister(Board, 0x10, 0xfff0, 0x9400);  // MAC address low = 0x940n (n = board id)
    ret &= CheckRegister(Board, 0x12, 0xffff, 0x0E13);  // MAC address middle = 0xOE13
    ret &= CheckRegister(Board, 0x14, 0xffff, 0xFA61);  // MAC address high = 0xFA61
    ret &= CheckRegister(Board, 0x84, 0x4000, 0x4000);  // Enable QMU transmit frame data pointer auto increment
    ret &= CheckRegister(Board, 0x70, 0x01ff, 0x01EF);  // Enable QMU transmit flow control, CRC, padding, and transmit module
    ret &= CheckRegister(Board, 0x86, 0x4000, 0x4000);  // Enable QMU receive frame data pointer auto increment
    ret &= CheckRegister(Board, 0x9C, 0x00ff, 0x0001);  // Configure receive frame threshold for 1 frame
    ret &= CheckRegister(Board, 0x74, 0xffff, 0x7CE1);  // Enable checksums, MAC address filtering, and receive module
    // Check multicast hash table
    unsigned char MulticastMAC[6];
    EthBasePort::GetDestMulticastMacAddr(MulticastMAC);
    uint8_t HashReg;
    uint16_t HashValue;
    ComputeMulticastHash(MulticastMAC, HashReg, HashValue);
    ret &= CheckRegister(Board, HashReg, 0xffff, HashValue);
    ret &= CheckRegister(Board, 0x82, 0x03f7, 0x0020);  // Enable QMU frame count threshold (1), no auto-dequeue
    ret &= CheckRegister(Board, 0x90, 0xffff, 0xa000);  // Enable receive and link change interrupts
    std::cout << "Checking ---- end ----" << "\n";
    return ret;
}